

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktApiObjectManagementTests.cpp
# Opt level: O2

TestStatus * __thiscall
vkt::api::anon_unknown_1::createSingleAllocCallbacksTest<vkt::api::(anonymous_namespace)::Buffer>
          (TestStatus *__return_storage_ptr__,anon_unknown_1 *this,Context *context,
          Parameters params)

{
  PlatformInterface *pPVar1;
  bool bVar2;
  VkAllocationCallbacks *pVVar3;
  DeviceInterface *pDVar4;
  VkDevice pVVar5;
  BinaryCollection *pBVar6;
  allocator<char> local_879;
  string local_878;
  string local_858;
  Parameters params_local;
  Environment rootEnv;
  AllocationCallbackRecorder objCallbacks;
  AllocationCallbackRecorder resCallbacks;
  Environment local_728;
  EnvClone resEnv;
  
  params_local.usage = (VkBufferUsageFlags)params.size;
  params_local.size = (VkDeviceSize)context;
  pVVar3 = ::vk::getSystemAllocator();
  ::vk::AllocationCallbackRecorder::AllocationCallbackRecorder(&resCallbacks,pVVar3,0x80);
  pPVar1 = *(PlatformInterface **)(this + 8);
  pDVar4 = Context::getDeviceInterface((Context *)this);
  pVVar5 = Context::getDevice((Context *)this);
  rootEnv.queueFamilyIndex = Context::getUniversalQueueFamilyIndex((Context *)this);
  pBVar6 = *(BinaryCollection **)(this + 0x10);
  rootEnv.allocationCallbacks =
       &resCallbacks.super_ChainedAllocator.super_AllocationCallbacks.m_callbacks;
  rootEnv.maxResourceConsumers = 1;
  rootEnv.vkp = pPVar1;
  rootEnv.vkd = pDVar4;
  rootEnv.device = pVVar5;
  rootEnv.programBinaries = pBVar6;
  objCallbacks.super_ChainedAllocator.super_AllocationCallbacks._vptr_AllocationCallbacks =
       (_func_int **)getDefaulDeviceParameters((Context *)this);
  EnvClone::EnvClone(&resEnv,&rootEnv,(Parameters *)&objCallbacks,(deUint32)pBVar6);
  pVVar3 = ::vk::getSystemAllocator();
  ::vk::AllocationCallbackRecorder::AllocationCallbackRecorder(&objCallbacks,pVVar3,0x80);
  local_728.allocationCallbacks =
       &objCallbacks.super_ChainedAllocator.super_AllocationCallbacks.m_callbacks;
  local_728.vkp = resEnv.env.vkp;
  local_728.vkd = resEnv.env.vkd;
  local_728.device = resEnv.env.device;
  local_728.queueFamilyIndex = resEnv.env.queueFamilyIndex;
  local_728.programBinaries = resEnv.env.programBinaries;
  local_728.maxResourceConsumers = resEnv.env.maxResourceConsumers;
  Buffer::create((Move<vk::Handle<(vk::HandleType)8>_> *)&local_858,&local_728,
                 (Resources *)&params_local,(Parameters *)(ulong)resEnv.env.queueFamilyIndex);
  local_878.field_2._M_allocated_capacity = local_858.field_2._M_allocated_capacity;
  local_878.field_2._8_8_ = local_858.field_2._8_8_;
  local_878._M_dataplus._M_p = local_858._M_dataplus._M_p;
  local_878._M_string_length = local_858._M_string_length;
  local_858._M_dataplus._M_p = (pointer)0x0;
  local_858._M_string_length = 0;
  local_858.field_2._M_allocated_capacity = 0;
  local_858.field_2._8_8_ = 0;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)8>_>::~RefBase
            ((RefBase<vk::Handle<(vk::HandleType)8>_> *)&local_858);
  bVar2 = ::vk::validateAndLog(*(TestLog **)(*(long *)this + 0x10),&objCallbacks,0x1e);
  if (bVar2) {
    ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)8>_>::~RefBase
              ((RefBase<vk::Handle<(vk::HandleType)8>_> *)&local_878);
    bVar2 = ::vk::validateAndLog(*(TestLog **)(*(long *)this + 0x10),&objCallbacks,0);
    if (bVar2) {
      ::vk::AllocationCallbackRecorder::~AllocationCallbackRecorder(&objCallbacks);
      EnvClone::~EnvClone(&resEnv);
      bVar2 = ::vk::validateAndLog(*(TestLog **)(*(long *)this + 0x10),&resCallbacks,0);
      if (bVar2) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&resEnv,"Ok",(allocator<char> *)&objCallbacks);
        tcu::TestStatus::pass(__return_storage_ptr__,(string *)&resEnv);
      }
      else {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&resEnv,"Invalid allocation callback",(allocator<char> *)&objCallbacks)
        ;
        tcu::TestStatus::fail(__return_storage_ptr__,(string *)&resEnv);
      }
      std::__cxx11::string::~string((string *)&resEnv);
      goto LAB_0047b1b2;
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_878,"Invalid allocation callback",(allocator<char> *)&local_858);
    tcu::TestStatus::fail(__return_storage_ptr__,&local_878);
    std::__cxx11::string::~string((string *)&local_878);
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_858,"Invalid allocation callback",&local_879);
    tcu::TestStatus::fail(__return_storage_ptr__,&local_858);
    std::__cxx11::string::~string((string *)&local_858);
    ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)8>_>::~RefBase
              ((RefBase<vk::Handle<(vk::HandleType)8>_> *)&local_878);
  }
  ::vk::AllocationCallbackRecorder::~AllocationCallbackRecorder(&objCallbacks);
  EnvClone::~EnvClone(&resEnv);
LAB_0047b1b2:
  ::vk::AllocationCallbackRecorder::~AllocationCallbackRecorder(&resCallbacks);
  return __return_storage_ptr__;
}

Assistant:

tcu::TestStatus createSingleAllocCallbacksTest (Context& context, typename Object::Parameters params)
{
	const deUint32						noCmdScope		= (1u << VK_SYSTEM_ALLOCATION_SCOPE_INSTANCE)
														| (1u << VK_SYSTEM_ALLOCATION_SCOPE_DEVICE)
														| (1u << VK_SYSTEM_ALLOCATION_SCOPE_CACHE)
														| (1u << VK_SYSTEM_ALLOCATION_SCOPE_OBJECT);

	// Callbacks used by resources
	AllocationCallbackRecorder			resCallbacks	(getSystemAllocator(), 128);

	// Root environment still uses default instance and device, created without callbacks
	const Environment					rootEnv			(context.getPlatformInterface(),
														 context.getDeviceInterface(),
														 context.getDevice(),
														 context.getUniversalQueueFamilyIndex(),
														 context.getBinaryCollection(),
														 resCallbacks.getCallbacks(),
														 1u);

	{
		// Test env has instance & device created with callbacks
		const EnvClone						resEnv		(rootEnv, getDefaulDeviceParameters(context), 1u);
		const typename Object::Resources	res			(resEnv.env, params);

		// Supply a separate callback recorder just for object construction
		AllocationCallbackRecorder			objCallbacks(getSystemAllocator(), 128);
		const Environment					objEnv		(resEnv.env.vkp,
														 resEnv.env.vkd,
														 resEnv.env.device,
														 resEnv.env.queueFamilyIndex,
														 resEnv.env.programBinaries,
														 objCallbacks.getCallbacks(),
														 resEnv.env.maxResourceConsumers);

		{
			Unique<typename Object::Type>	obj	(Object::create(objEnv, res, params));

			// Validate that no command-level allocations are live
			if (!validateAndLog(context.getTestContext().getLog(), objCallbacks, noCmdScope))
				return tcu::TestStatus::fail("Invalid allocation callback");
		}

		// At this point all allocations made against object callbacks must have been freed
		if (!validateAndLog(context.getTestContext().getLog(), objCallbacks, 0u))
			return tcu::TestStatus::fail("Invalid allocation callback");
	}

	if (!validateAndLog(context.getTestContext().getLog(), resCallbacks, 0u))
		return tcu::TestStatus::fail("Invalid allocation callback");

	return tcu::TestStatus::pass("Ok");
}